

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::BasicAPITexParam::Run(BasicAPITexParam *this)

{
  GLuint local_24;
  float local_20;
  GLuint ui;
  GLfloat f;
  GLint i;
  BasicAPITexParam *this_local;
  
  _f = this;
  glu::CallLogWrapper::glGenTextures
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_texture);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0xde1,this->m_texture);
  glu::CallLogWrapper::glTexImage2D
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0xde1,0,0x8230,0x10,0x10,0,0x1903,0x1406,(void *)0x0);
  glu::CallLogWrapper::glGetTexParameteriv
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0xde1,0x90c7,(GLint *)&ui);
  if (ui == 0x90c8) {
    glu::CallLogWrapper::glGetTexParameterfv
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,0x90c7,&local_20);
    if ((int)(long)local_20 == 0x90c8) {
      glu::CallLogWrapper::glGetTexParameterIiv
                (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0xde1,0x90c7,(GLint *)&ui);
      if (ui == 0x90c8) {
        glu::CallLogWrapper::glGetTexParameterIuiv
                  (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0xde1,0x90c7,&local_24);
        if (local_24 == 0x90c8) {
          this_local = (BasicAPITexParam *)0x0;
        }
        else {
          anon_unknown_0::Output
                    (
                    "GL_IMAGE_FORMAT_COMPATIBILITY_TYPE should equal to GL_IMAGE_FORMAT_COMPATIBILITY_BY_SIZE for textures allocated by the GL."
                    );
          this_local = (BasicAPITexParam *)&DAT_ffffffffffffffff;
        }
      }
      else {
        anon_unknown_0::Output
                  (
                  "GL_IMAGE_FORMAT_COMPATIBILITY_TYPE should equal to GL_IMAGE_FORMAT_COMPATIBILITY_BY_SIZE for textures allocated by the GL."
                  );
        this_local = (BasicAPITexParam *)&DAT_ffffffffffffffff;
      }
    }
    else {
      anon_unknown_0::Output
                (
                "GL_IMAGE_FORMAT_COMPATIBILITY_TYPE should equal to GL_IMAGE_FORMAT_COMPATIBILITY_BY_SIZE for textures allocated by the GL."
                );
      this_local = (BasicAPITexParam *)&DAT_ffffffffffffffff;
    }
  }
  else {
    anon_unknown_0::Output
              (
              "GL_IMAGE_FORMAT_COMPATIBILITY_TYPE should equal to GL_IMAGE_FORMAT_COMPATIBILITY_BY_SIZE for textures allocated by the GL."
              );
    this_local = (BasicAPITexParam *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		glGenTextures(1, &m_texture);
		glBindTexture(GL_TEXTURE_2D, m_texture);
		glTexImage2D(GL_TEXTURE_2D, 0, GL_RG32F, 16, 16, 0, GL_RED, GL_FLOAT, NULL);

		GLint   i;
		GLfloat f;
		GLuint  ui;

		glGetTexParameteriv(GL_TEXTURE_2D, GL_IMAGE_FORMAT_COMPATIBILITY_TYPE, &i);
		if (i != GL_IMAGE_FORMAT_COMPATIBILITY_BY_SIZE)
		{
			Output("GL_IMAGE_FORMAT_COMPATIBILITY_TYPE should equal to "
				   "GL_IMAGE_FORMAT_COMPATIBILITY_BY_SIZE for textures allocated by the GL.");
			return ERROR;
		}
		glGetTexParameterfv(GL_TEXTURE_2D, GL_IMAGE_FORMAT_COMPATIBILITY_TYPE, &f);
		if (static_cast<GLenum>(f) != GL_IMAGE_FORMAT_COMPATIBILITY_BY_SIZE)
		{
			Output("GL_IMAGE_FORMAT_COMPATIBILITY_TYPE should equal to "
				   "GL_IMAGE_FORMAT_COMPATIBILITY_BY_SIZE for textures allocated by the GL.");
			return ERROR;
		}
		glGetTexParameterIiv(GL_TEXTURE_2D, GL_IMAGE_FORMAT_COMPATIBILITY_TYPE, &i);
		if (i != GL_IMAGE_FORMAT_COMPATIBILITY_BY_SIZE)
		{
			Output("GL_IMAGE_FORMAT_COMPATIBILITY_TYPE should equal to "
				   "GL_IMAGE_FORMAT_COMPATIBILITY_BY_SIZE for textures allocated by the GL.");
			return ERROR;
		}
		glGetTexParameterIuiv(GL_TEXTURE_2D, GL_IMAGE_FORMAT_COMPATIBILITY_TYPE, &ui);
		if (ui != GL_IMAGE_FORMAT_COMPATIBILITY_BY_SIZE)
		{
			Output("GL_IMAGE_FORMAT_COMPATIBILITY_TYPE should equal to "
				   "GL_IMAGE_FORMAT_COMPATIBILITY_BY_SIZE for textures allocated by the GL.");
			return ERROR;
		}

		return NO_ERROR;
	}